

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operators.hpp
# Opt level: O0

string * operator*(string *__return_storage_ptr__,
                  basic_string_view<char,_std::char_traits<char>_> *generic_string,uint integer)

{
  undefined4 local_1c;
  uint integer_local;
  basic_string_view<char,_std::char_traits<char>_> *generic_string_local;
  string *output;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::basic_string_view<char,_std::char_traits<char>_>::size(generic_string);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  local_1c = integer;
  while (local_1c != 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,generic_string);
    local_1c = local_1c - 1;
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string operator *( const T& generic_string, unsigned int integer ) 
 {
  std::string output;
  output.reserve( integer * generic_string.size() );

  while( integer -- ) 
   {
    output += generic_string;
   }
   
  return output;
 }